

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

char * uprv_getDefaultLocaleID_63(void)

{
  uint uVar1;
  int iVar2;
  byte *pbVar3;
  char *pcVar4;
  size_t sVar5;
  char *__dest;
  char *pcVar6;
  char *__s;
  
  if ((byte *)uprv_getPOSIXIDForDefaultLocale()::posixID == (byte *)0x0) {
    pbVar3 = (byte *)setlocale(5,(char *)0x0);
    if (pbVar3 == (byte *)0x0) {
LAB_0028417a:
      pbVar3 = (byte *)getenv("LC_ALL");
      if ((pbVar3 != (byte *)0x0) ||
         ((pbVar3 = (byte *)getenv("LC_MESSAGES"), pbVar3 != (byte *)0x0 ||
          (pbVar3 = (byte *)getenv("LANG"), pbVar3 != (byte *)0x0)))) goto LAB_002841b0;
    }
    else {
      uVar1 = *pbVar3 - 0x43;
      if (uVar1 == 0) {
        uVar1 = (uint)pbVar3[1];
      }
      if ((uVar1 == 0) || (iVar2 = strcmp("POSIX",(char *)pbVar3), iVar2 == 0)) goto LAB_0028417a;
LAB_002841b0:
      uVar1 = *pbVar3 - 0x43;
      if (uVar1 == 0) {
        uVar1 = (uint)pbVar3[1];
      }
      if ((uVar1 != 0) &&
         (iVar2 = strcmp("POSIX",(char *)pbVar3),
         uprv_getPOSIXIDForDefaultLocale()::posixID = (char *)pbVar3, iVar2 != 0))
      goto LAB_002841e3;
    }
    uprv_getPOSIXIDForDefaultLocale()::posixID = "en_US_POSIX";
  }
LAB_002841e3:
  pbVar3 = (byte *)uprv_getPOSIXIDForDefaultLocale()::posixID;
  if (gCorrectedPOSIXLocale != (char *)0x0) {
    return gCorrectedPOSIXLocale;
  }
  pcVar4 = strchr(uprv_getPOSIXIDForDefaultLocale()::posixID,0x2e);
  if (pcVar4 == (char *)0x0) {
    __dest = (char *)0x0;
LAB_0028425c:
    pcVar4 = strrchr((char *)pbVar3,0x40);
    if (pcVar4 == (char *)0x0) {
      if (__dest == (char *)0x0) {
        sVar5 = strlen((char *)pbVar3);
        __dest = (char *)uprv_malloc_63(sVar5 + 1);
        if (__dest == (char *)0x0) goto LAB_0028431d;
        strcpy(__dest,(char *)pbVar3);
      }
    }
    else {
      if (__dest == (char *)0x0) {
        sVar5 = strlen((char *)pbVar3);
        __dest = (char *)uprv_malloc_63(sVar5 + 2);
        if (__dest == (char *)0x0) goto LAB_0028431d;
        strncpy(__dest,(char *)pbVar3,(long)pcVar4 - (long)pbVar3);
        __dest[(long)pcVar4 - (long)pbVar3] = '\0';
      }
      iVar2 = strcmp(pcVar4 + 1,"nynorsk");
      __s = "NY";
      if (iVar2 != 0) {
        __s = pcVar4 + 1;
      }
      pcVar4 = strchr(__dest,0x5f);
      sVar5 = strlen(__dest);
      pcVar6 = __dest + sVar5;
      if (pcVar4 == (char *)0x0) {
        pcVar6[2] = '\0';
        pcVar6[0] = '_';
        pcVar6[1] = '_';
      }
      else {
        pcVar6[0] = '_';
        pcVar6[1] = '\0';
      }
      pcVar4 = strchr(__s,0x2e);
      if (pcVar4 == (char *)0x0) {
        strcat(__dest,__s);
      }
      else {
        sVar5 = strlen(__dest);
        strncat(__dest,__s,(long)pcVar4 - (long)__s);
        __dest[(int)sVar5 + (int)((long)pcVar4 - (long)__s)] = '\0';
      }
    }
    if (gCorrectedPOSIXLocale == (char *)0x0) {
      gCorrectedPOSIXLocaleHeapAllocated = 1;
      gCorrectedPOSIXLocale = __dest;
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
    }
    else {
      uprv_free_63(__dest);
    }
  }
  else {
    sVar5 = strlen((char *)pbVar3);
    __dest = (char *)uprv_malloc_63(sVar5 + 1);
    if (__dest != (char *)0x0) {
      strncpy(__dest,(char *)pbVar3,(long)pcVar4 - (long)pbVar3);
      __dest[(long)pcVar4 - (long)pbVar3] = '\0';
      pcVar4 = strchr(__dest,0x40);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
      }
      goto LAB_0028425c;
    }
LAB_0028431d:
    __dest = (char *)0x0;
  }
  return __dest;
}

Assistant:

static const char *uprv_getPOSIXIDForDefaultLocale(void)
{
    static const char* posixID = NULL;
    if (posixID == 0) {
        posixID = uprv_getPOSIXIDForCategory(LC_MESSAGES);
    }
    return posixID;
}